

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

PyObject * pybind11::detail::dict_getitemstring(PyObject *v,char *key)

{
  PyObject *op;
  PyObject *pPVar1;
  long lVar2;
  error_already_set *this;
  
  op = (PyObject *)PyUnicode_FromString(key);
  if (op == (PyObject *)0x0) {
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
LAB_00111cc8:
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pPVar1 = (PyObject *)PyDict_GetItemWithError(v,op);
  _Py_DECREF(op);
  if (pPVar1 == (PyObject *)0x0) {
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_00111cc8;
    }
  }
  return pPVar1;
}

Assistant:

inline PyObject *dict_getitemstring(PyObject *v, const char *key) {
#if PY_MAJOR_VERSION >= 3
    PyObject *kv = nullptr, *rv = nullptr;
    kv = PyUnicode_FromString(key);
    if (kv == NULL) {
        throw error_already_set();
    }

    rv = PyDict_GetItemWithError(v, kv);
    Py_DECREF(kv);
    if (rv == NULL && PyErr_Occurred()) {
        throw error_already_set();
    }
    return rv;
#else
    return PyDict_GetItemString(v, key);
#endif
}